

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O0

void __thiscall
imrt::Ant::generateTour
          (Ant *this,
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          *probability,vector<maths::Matrix,_std::allocator<maths::Matrix>_> *iprobability)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pair<int,_int> pVar5;
  reference this_00;
  reference this_01;
  mapped_type *this_02;
  double *pdVar6;
  mapped_type *this_03;
  reference pvVar7;
  pair<int,_int> pVar8;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *in_RDX;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *in_RSI;
  key_type_conflict *in_RDI;
  int r;
  int j;
  int i;
  int ap;
  int s;
  Station *st;
  bool flag;
  double aux;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  pair<int,_int> in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  pair<int,_int> in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined1 local_21;
  
  for (local_34 = 0; local_34 < in_RDI[0x11]; local_34 = local_34 + 1) {
    pVar5 = (pair<int,_int>)
            Plan::get_station((Plan *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    for (local_38 = 0; local_38 < in_RDI[0x10]; local_38 = local_38 + 1) {
      iVar2 = rand();
      local_21 = 0;
      local_3c = 0;
      while( true ) {
        in_stack_ffffffffffffffa0 = local_3c;
        iVar3 = Collimator::getIntensityLevelSize((Collimator *)0x143724);
        uVar1 = in_stack_ffffffffffffffa4 & 0xffffff;
        if (in_stack_ffffffffffffffa0 < iVar3) {
          uVar1 = CONCAT13(local_21,(int3)in_stack_ffffffffffffffa4) ^ 0xff000000;
        }
        in_stack_ffffffffffffffa4 = uVar1;
        if ((in_stack_ffffffffffffffa4 & 0x1000000) == 0) break;
        this_00 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                            (in_RDX,(long)local_34);
        pdVar6 = maths::Matrix::operator()(this_00,local_38,local_3c);
        if ((double)iVar2 / 2147483647.0 <= *pdVar6) {
          in_stack_ffffffffffffff8c = local_3c;
          this_01 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)(in_RDI + 8),(long)local_34);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_38);
          *pvVar7 = in_stack_ffffffffffffff8c;
          in_stack_ffffffffffffff90 = pVar5;
          Collimator::getLevelIntensity
                    ((Collimator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          Station::setApertureIntensity
                    ((Station *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c,(double)in_stack_ffffffffffffff70);
          local_21 = 1;
        }
        local_3c = local_3c + 1;
      }
      local_40 = 0;
      while( true ) {
        iVar2 = local_40;
        iVar3 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xe));
        if (iVar3 <= iVar2) break;
        iVar3 = rand();
        local_21 = 0;
        local_44 = 0;
        while( true ) {
          in_stack_ffffffffffffff80 = local_44;
          iVar4 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xe));
          uVar1 = in_stack_ffffffffffffff84 & 0xffffff;
          if (in_stack_ffffffffffffff80 < iVar4) {
            uVar1 = CONCAT13(local_21,(int3)in_stack_ffffffffffffff84) ^ 0xff000000;
          }
          in_stack_ffffffffffffff84 = uVar1;
          if ((in_stack_ffffffffffffff84 & 0x1000000) == 0) break;
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[](in_RSI,(long)local_34);
          this_02 = std::
                    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                    ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 in_RDI);
          pdVar6 = maths::Matrix::operator()(this_02,local_40,local_44);
          if ((double)iVar3 / 2147483647.0 <= *pdVar6) {
            in_stack_ffffffffffffff6c = local_44;
            std::
            vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::operator[]((vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                          *)(in_RDI + 2),(long)local_34);
            this_03 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                   in_RDI);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_03,(long)local_40);
            *pvVar7 = in_stack_ffffffffffffff6c;
            in_stack_ffffffffffffff70 = pVar5;
            in_stack_ffffffffffffff7c = local_40;
            pVar8 = Collimator::getReference
                              ((Collimator *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
            in_stack_ffffffffffffffb4 = pVar8.first;
            Station::setApertureShape
                      ((Station *)CONCAT44(in_stack_ffffffffffffff8c,iVar2),
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff90
                      );
            local_21 = 1;
          }
          local_44 = local_44 + 1;
        }
        local_40 = local_40 + 1;
      }
    }
    Station::generateIntensity
              ((Station *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  Plan::eval((Plan *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void Ant::generateTour(vector<map <int, Matrix>> & probability, vector<Matrix>& iprobability) {
    double aux;
    bool flag;
    Station * st;
    for (int s = 0; s < n_stations; s++) {
      st = p->get_station(s);
      for (int ap=0; ap < n_apertures; ap++) {
        // Choose intensity
        aux = rand() / double(RAND_MAX);
        flag=false;
        for (int i=0; i< collimator.getIntensityLevelSize() && !flag; i++){
          if (iprobability[s](ap,i) >= aux ) {
            ref_intensity[s][ap]=i;
            st->setApertureIntensity(ap, collimator.getLevelIntensity(i));
            flag=true;
          }
        }
        
        // Choose aperture pattern 
        for (int j = 0; j < collimator.getXdim(); j++) {
          aux = rand() / double(RAND_MAX);
          flag = false;
          for (int r = 0; r < collimator.getReferenceSize() && !flag; r++) {
            if (probability[s][ap](j,r) >= aux) {
              ref_plan[s][ap][j] = r;
              st->setApertureShape(ap,j,collimator.getReference(r));
              flag = true;
            }
          }
        }
      }
      st->generateIntensity();
    }
    p->eval();
  }